

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_gated_linear_attn
          (ggml_context *ctx,ggml_tensor *k,ggml_tensor *v,ggml_tensor *q,ggml_tensor *g,
          ggml_tensor *state,float scale)

{
  long lVar1;
  _Bool _Var2;
  ggml_tensor *pgVar3;
  char *pcVar4;
  int line;
  int64_t ne [4];
  long local_58;
  long local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  _Var2 = ggml_is_contiguous_n(k,0);
  if (_Var2) {
    _Var2 = ggml_is_contiguous_n(v,0);
    if (_Var2) {
      _Var2 = ggml_is_contiguous_n(q,0);
      if (_Var2) {
        _Var2 = ggml_is_contiguous_n(g,0);
        if (_Var2) {
          _Var2 = ggml_is_contiguous_n(state,0);
          if (_Var2) {
            local_50 = k->ne[0];
            if (((v->ne[0] == local_50) && (local_58 = k->ne[1], v->ne[1] == local_58)) &&
               (lVar1 = k->ne[2], v->ne[2] == lVar1)) {
              if (((q->ne[0] == local_50) && (q->ne[1] == local_58)) && (q->ne[2] == lVar1)) {
                if (((g->ne[0] == local_50) && (g->ne[1] == local_58)) && (g->ne[2] == lVar1)) {
                  local_58 = local_58 * local_50;
                  local_50 = local_50 * state->ne[1];
                  if (state->ne[0] * state->ne[1] * state->ne[2] * state->ne[3] -
                      local_58 * local_50 == 0) {
                    local_50 = local_50 + lVar1;
                    local_48 = 1;
                    local_40 = 1;
                    pgVar3 = ggml_new_tensor_impl
                                       (ctx,GGML_TYPE_F32,4,&local_58,(ggml_tensor *)0x0,0);
                    pgVar3->op_params[0] = (int32_t)scale;
                    pgVar3->op = GGML_OP_GATED_LINEAR_ATTN;
                    pgVar3->src[0] = k;
                    pgVar3->src[1] = v;
                    pgVar3->src[2] = q;
                    pgVar3->src[3] = g;
                    pgVar3->src[4] = state;
                    return pgVar3;
                  }
                  pcVar4 = "ggml_nelements(state) == S * S * H * n_seqs";
                  line = 0x12b5;
                }
                else {
                  pcVar4 = "g->ne[0] == S && g->ne[1] == H && g->ne[2] == n_tokens";
                  line = 0x12b4;
                }
              }
              else {
                pcVar4 = "q->ne[0] == S && q->ne[1] == H && q->ne[2] == n_tokens";
                line = 0x12b3;
              }
            }
            else {
              pcVar4 = "v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens";
              line = 0x12b2;
            }
          }
          else {
            pcVar4 = "ggml_is_contiguous(state)";
            line = 0x12ab;
          }
        }
        else {
          pcVar4 = "ggml_is_contiguous(g)";
          line = 0x12aa;
        }
      }
      else {
        pcVar4 = "ggml_is_contiguous(q)";
        line = 0x12a9;
      }
    }
    else {
      pcVar4 = "ggml_is_contiguous(v)";
      line = 0x12a8;
    }
  }
  else {
    pcVar4 = "ggml_is_contiguous(k)";
    line = 0x12a7;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

struct ggml_tensor * ggml_gated_linear_attn(
        struct ggml_context * ctx,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * q,
        struct ggml_tensor  * g,
        struct ggml_tensor  * state,
        float scale) {
    GGML_ASSERT(ggml_is_contiguous(k));
    GGML_ASSERT(ggml_is_contiguous(v));
    GGML_ASSERT(ggml_is_contiguous(q));
    GGML_ASSERT(ggml_is_contiguous(g));
    GGML_ASSERT(ggml_is_contiguous(state));

    const int64_t S = k->ne[0];
    const int64_t H = k->ne[1];
    const int64_t n_tokens = k->ne[2];
    const int64_t n_seqs = state->ne[1];
    {
        GGML_ASSERT(v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens);
        GGML_ASSERT(q->ne[0] == S && q->ne[1] == H && q->ne[2] == n_tokens);
        GGML_ASSERT(g->ne[0] == S && g->ne[1] == H && g->ne[2] == n_tokens);
        GGML_ASSERT(ggml_nelements(state) == S * S * H * n_seqs);
    }

    // concat output and new_state
    const int64_t ne[4] = { S * H, n_tokens + S * n_seqs, 1, 1 };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    ggml_set_op_params_f32(result, 0, scale);

    result->op     = GGML_OP_GATED_LINEAR_ATTN;
    result->src[0] = k;
    result->src[1] = v;
    result->src[2] = q;
    result->src[3] = g;
    result->src[4] = state;

    return result;
}